

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
ninx::parser::element::Block::make_text_block(Block *parent,string *text)

{
  _func_int **pp_Var1;
  pointer *__ptr;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  block_statements;
  _Head_base<0UL,_ninx::parser::element::Statement_*,_false> local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [32];
  
  std::make_unique<ninx::parser::element::TextElement,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  local_48._M_head_impl = (Statement *)local_40;
  local_38._16_8_ = 0;
  local_40 = (undefined1  [8])0x0;
  local_38._0_8_ = (pointer)0x0;
  local_38._8_8_ = 0;
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>
  ::
  emplace_back<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>
              *)local_38,
             (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
              *)&local_48);
  if (local_48._M_head_impl != (Statement *)0x0) {
    (*((local_48._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
  }
  std::
  make_unique<ninx::parser::element::Block,std::vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
              *)parent);
  pp_Var1 = (parent->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement;
  (**(code **)(*pp_Var1 + 0x20))(pp_Var1,text);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
             *)local_38);
  if (local_40 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )parent;
}

Assistant:

std::unique_ptr<ninx::parser::element::Block>
ninx::parser::element::Block::make_text_block(Block *parent, const std::string &text) {
    auto element{std::make_unique<TextElement>(text)};
    std::vector<std::unique_ptr<Statement>> block_statements;
    block_statements.push_back(std::move(element));

    auto block{std::make_unique<Block>(std::move(block_statements))};
    block->set_parent(parent);

    return block;
}